

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 34_findFirstAndLastPositionInSortedArray.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
searchRange(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
           vector<int,_std::allocator<int>_> *nums,int target)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  allocator<int> local_79;
  int local_78;
  int local_74;
  iterator local_70;
  size_type local_68;
  byte local_4a;
  allocator<int> local_49;
  int local_48 [2];
  iterator local_40;
  size_type local_38;
  int local_30;
  int local_2c;
  int right;
  int left;
  int mid;
  int end;
  int start;
  int target_local;
  vector<int,_std::allocator<int>_> *nums_local;
  
  mid = 0;
  end = target;
  _start = nums;
  nums_local = __return_storage_ptr__;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(nums);
  left = (int)sVar2;
  while (iVar1 = end, mid < left) {
    right = (mid + left) / 2;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](_start,(long)right);
    if (*pvVar3 < iVar1) {
      mid = right + 1;
    }
    else {
      left = right;
    }
  }
  local_2c = mid;
  mid = 0;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(_start);
  left = (int)sVar2;
  while (iVar1 = end, mid < left) {
    right = (mid + left) / 2;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](_start,(long)right);
    if (iVar1 < *pvVar3) {
      left = right;
    }
    else {
      mid = right + 1;
    }
  }
  local_30 = mid;
  local_4a = 0;
  if (local_2c == mid) {
    local_48[0] = -1;
    local_48[1] = 0xffffffff;
    local_40 = local_48;
    local_38 = 2;
    std::allocator<int>::allocator(&local_49);
    local_4a = 1;
    __l_00._M_len = local_38;
    __l_00._M_array = local_40;
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__l_00,&local_49);
  }
  else {
    local_78 = local_2c;
    local_74 = mid + -1;
    local_70 = &local_78;
    local_68 = 2;
    std::allocator<int>::allocator(&local_79);
    __l._M_len = local_68;
    __l._M_array = local_70;
    std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__l,&local_79);
    std::allocator<int>::~allocator(&local_79);
  }
  if ((local_4a & 1) != 0) {
    std::allocator<int>::~allocator(&local_49);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> searchRange(vector<int>& nums, int target) {
    int start=0,end=nums.size(),mid,left,right;
    while (start<end)
    {
        mid=(start+end)/2;
        if (target<=nums[mid])
            end=mid;
        else
            start=mid+1;
    }
    left=start;
    start=0,end=nums.size();
    while (start<end)
    {
        mid=(start+end)/2;
        if (target<nums[mid])
            end=mid;
        else
            start=mid+1;
    }
    right=start;
    return left==right ? vector<int> {-1,-1} : vector<int>{left,right-1};
}